

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffertest.cc
# Opt level: O0

void TestSeekAndTell(void)

{
  bool bVar1;
  ostream *poVar2;
  size_type sVar3;
  const_string *file;
  size_type line_num;
  undefined1 auVar4 [16];
  istream is;
  OutputBuffer *buf;
  int i;
  ostream os;
  string junk;
  lazy_ostream *in_stack_fffffffffffff898;
  char *__off;
  fpos<__mbstate_t> *in_stack_fffffffffffff8a0;
  char *in_stack_fffffffffffff8a8;
  begin *in_stack_fffffffffffff8b0;
  size_t in_stack_fffffffffffff8c8;
  const_string *in_stack_fffffffffffff8d8;
  const_string *msg;
  size_t in_stack_fffffffffffff8e0;
  const_string *in_stack_fffffffffffff8e8;
  undefined7 in_stack_fffffffffffff8f0;
  undefined1 in_stack_fffffffffffff8f7;
  begin *in_stack_fffffffffffff908;
  unit_test_log_t *in_stack_fffffffffffff910;
  fpos<__mbstate_t> local_608;
  undefined1 local_5f8 [16];
  basic_cstring<const_char> local_5e8;
  undefined1 local_5d8 [56];
  basic_cstring<const_char> local_5a0;
  undefined8 local_590;
  undefined8 local_588;
  fpos<__mbstate_t> local_580;
  undefined1 local_570 [16];
  basic_cstring<const_char> local_560;
  undefined1 local_550 [56];
  basic_cstring<const_char> local_518;
  undefined8 local_508;
  undefined8 local_500;
  fpos<__mbstate_t> local_4f8;
  undefined1 local_4e8 [16];
  basic_cstring<const_char> local_4d8;
  undefined1 local_4c8 [56];
  basic_cstring<const_char> local_490;
  undefined8 local_480;
  undefined8 local_478;
  fpos<__mbstate_t> local_470;
  undefined1 local_460 [16];
  basic_cstring<const_char> local_450;
  undefined1 local_440 [56];
  basic_cstring<const_char> local_408;
  undefined8 local_3f8;
  undefined8 local_3f0;
  fpos<__mbstate_t> local_3e8;
  basic_cstring<const_char> local_3d8;
  undefined1 local_3c8 [56];
  basic_cstring<const_char> local_390;
  undefined1 local_380 [400];
  OutputBuffer *local_1f0;
  int local_1e4;
  ostream local_1e0;
  string local_80 [80];
  basic_cstring<const_char> local_30 [3];
  
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
             ,0x6d);
  boost::unit_test::log::begin::begin
            (in_stack_fffffffffffff8b0,(const_string *)in_stack_fffffffffffff8a8,
             (size_t)in_stack_fffffffffffff8a0);
  boost::unit_test::unit_test_log_t::operator<<(in_stack_fffffffffffff910,in_stack_fffffffffffff908)
  ;
  boost::unit_test::unit_test_log_t::operator()
            ((unit_test_log_t *)in_stack_fffffffffffff8a8,
             (log_level)((ulong)in_stack_fffffffffffff8a0 >> 0x20));
  boost::unit_test::lazy_ostream::instance();
  boost::unit_test::operator<<
            ((lazy_ostream *)in_stack_fffffffffffff8a8,(char (*) [16])in_stack_fffffffffffff8a0);
  boost::unit_test::ut_detail::entry_value_collector::operator<<
            ((entry_value_collector *)in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
  boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[16],_const_char_(&)[16]>
  ::~lazy_ostream_impl
            ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[16],_const_char_(&)[16]> *)
             0x2321a4);
  boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
            ((entry_value_collector *)in_stack_fffffffffffff8a0);
  makeString_abi_cxx11_(in_stack_fffffffffffff8c8);
  avro::ostream::ostream((ostream *)in_stack_fffffffffffff8b0);
  for (local_1e4 = 0; local_1e4 < 5; local_1e4 = local_1e4 + 1) {
    std::operator<<(&local_1e0,local_80);
  }
  local_1f0 = avro::ostream::getBuffer((ostream *)0x23229f);
  poVar2 = std::operator<<((ostream *)&std::cout,"Buffer has ");
  sVar3 = avro::OutputBuffer::size((OutputBuffer *)0x2322e3);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
  std::operator<<(poVar2," bytes\n");
  avro::ostream::getBuffer((ostream *)0x23232f);
  avro::istream::istream
            ((istream *)in_stack_fffffffffffff8b0,(OutputBuffer *)in_stack_fffffffffffff8a8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_390,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff8a0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff8f7,in_stack_fffffffffffff8f0),
               in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff8a8,(char (*) [1])in_stack_fffffffffffff8a0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3d8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    avro::istream::getBuffer((istream *)0x232404);
    local_3e8._M_state = (__mbstate_t)avro::InputBuffer::size((InputBuffer *)0x23241b);
    local_3e8._M_off = std::__cxx11::string::size();
    local_3e8._M_off = local_3e8._M_off * local_1e4;
    in_stack_fffffffffffff8a8 = "junk.size() * i";
    in_stack_fffffffffffff8a0 = &local_3e8;
    __off = "is.getBuffer().size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_3c8,&local_3d8,0x1e9,1,2,&local_3e8._M_state);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x2324b6);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::fpos<__mbstate_t>::fpos(in_stack_fffffffffffff8a0,(streamoff)__off);
  std::istream::seekg(local_380,local_3f8,local_3f0);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_408,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff8a0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff8f7,in_stack_fffffffffffff8f0),
               in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff8a8,(char (*) [1])in_stack_fffffffffffff8a0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_450,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    auVar4 = std::istream::tellg();
    local_460 = auVar4;
    std::fpos<__mbstate_t>::fpos(in_stack_fffffffffffff8a0,(streamoff)__off);
    in_stack_fffffffffffff8a8 = "static_cast<std::streampos>(2000)";
    in_stack_fffffffffffff8a0 = &local_470;
    __off = "is.tellg()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::fpos<__mbstate_t>,std::fpos<__mbstate_t>>
              (local_440,&local_450,0x1eb,1,2,local_460);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x232662);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::fpos<__mbstate_t>::fpos(in_stack_fffffffffffff8a0,(streamoff)__off);
  std::istream::seekg(local_380,local_480,local_478);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_490,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff8a0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff8f7,in_stack_fffffffffffff8f0),
               in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff8a8,(char (*) [1])in_stack_fffffffffffff8a0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4d8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    auVar4 = std::istream::tellg();
    local_4e8 = auVar4;
    std::fpos<__mbstate_t>::fpos(in_stack_fffffffffffff8a0,(streamoff)__off);
    in_stack_fffffffffffff8a8 = "static_cast<std::streampos>(6000)";
    in_stack_fffffffffffff8a0 = &local_4f8;
    __off = "is.tellg()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::fpos<__mbstate_t>,std::fpos<__mbstate_t>>
              (local_4c8,&local_4d8,0x1ed,1,2,local_4e8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x23280e);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  avro::istream::getBuffer((istream *)0x23283a);
  avro::InputBuffer::size((InputBuffer *)0x232851);
  std::fpos<__mbstate_t>::fpos(in_stack_fffffffffffff8a0,(streamoff)__off);
  std::istream::seekg(local_380,local_508,local_500);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_518,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff8a0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff8f7,in_stack_fffffffffffff8f0),
               in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff8a8,(char (*) [1])in_stack_fffffffffffff8a0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_560,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    auVar4 = std::istream::tellg();
    local_570 = auVar4;
    avro::istream::getBuffer((istream *)0x232978);
    avro::InputBuffer::size((InputBuffer *)0x232989);
    std::fpos<__mbstate_t>::fpos(in_stack_fffffffffffff8a0,(streamoff)__off);
    in_stack_fffffffffffff8a8 = "static_cast<std::streampos>(is.getBuffer().size())";
    in_stack_fffffffffffff8a0 = &local_580;
    __off = "is.tellg()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::fpos<__mbstate_t>,std::fpos<__mbstate_t>>
              (local_550,&local_560,0x1ef,1,2,local_570);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x232a04);
    in_stack_fffffffffffff8f7 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffff8f7);
  file = (const_string *)avro::istream::getBuffer((istream *)0x232a2a);
  line_num = avro::InputBuffer::size((InputBuffer *)0x232a3b);
  std::fpos<__mbstate_t>::fpos(in_stack_fffffffffffff8a0,(streamoff)__off);
  std::istream::seekg(local_380,local_590,local_588);
  do {
    msg = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_5a0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff8a0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff8f7,in_stack_fffffffffffff8f0),file
               ,line_num,msg);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff8a8,(char (*) [1])in_stack_fffffffffffff8a0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_5e8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    auVar4 = std::istream::tellg();
    local_5f8 = auVar4;
    std::fpos<__mbstate_t>::fpos(in_stack_fffffffffffff8a0,(streamoff)__off);
    in_stack_fffffffffffff8a8 = "static_cast<std::streampos>(-1)";
    in_stack_fffffffffffff8a0 = &local_608;
    __off = "is.tellg()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::fpos<__mbstate_t>,std::fpos<__mbstate_t>>
              (local_5d8,&local_5e8,0x1f1,1,2,local_5f8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x232bbc);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  avro::istream::~istream((istream *)in_stack_fffffffffffff8a0);
  avro::ostream::~ostream((ostream *)in_stack_fffffffffffff8a0);
  std::__cxx11::string::~string(local_80);
  return;
}

Assistant:

void TestSeekAndTell()
{
    BOOST_TEST_MESSAGE( "TestSeekAndTell");

    {
        std::string junk = makeString(kDefaultBlockSize/2);

        ostream os;

        // write enough bytes to a buffer, to create at least 3 blocks
        int i = 0;
        for(; i < 5; ++i) {
            os << junk;
        }

        const OutputBuffer &buf = os.getBuffer();
        cout << "Buffer has " << buf.size() << " bytes\n";

        istream is(os.getBuffer());
        BOOST_CHECK_EQUAL(is.getBuffer().size(), junk.size() * i);
        is.seekg(2000);
        BOOST_CHECK_EQUAL(is.tellg(), static_cast<std::streampos>(2000));
        is.seekg(6000);
        BOOST_CHECK_EQUAL(is.tellg(), static_cast<std::streampos>(6000));
        is.seekg(is.getBuffer().size());
        BOOST_CHECK_EQUAL(is.tellg(), static_cast<std::streampos>(is.getBuffer().size()));
        is.seekg(is.getBuffer().size()+1);
        BOOST_CHECK_EQUAL(is.tellg(), static_cast<std::streampos>(-1));

    }
}